

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

Bigint * pow5mult(Bigint *b,int k)

{
  Bigint *pBVar1;
  Bigint *b_00;
  Bigint *pBVar2;
  long lVar3;
  uint uVar4;
  
  if ((k & 3U) != 0) {
    b = multadd(b,pow5mult::p05[(k & 3U) - 1],0);
  }
  if ((uint)k < 4) {
    return b;
  }
  uVar4 = (uint)k >> 2;
  pBVar1 = TI0.P5s;
  if (TI0.P5s != (Bigint *)0x0) goto LAB_001110ea;
  pBVar1 = Balloc(1);
  pBVar1->wds = 1;
  pBVar1->x[0] = 0x271;
  TI0.P5s = pBVar1;
  do {
    pBVar1->next = (Bigint *)0x0;
LAB_001110ea:
    do {
      b_00 = pBVar1;
      pBVar2 = b;
      if (((uVar4 & 1) != 0) && (pBVar2 = mult(b,b_00), b != (Bigint *)0x0)) {
        lVar3 = (long)b->k;
        if (lVar3 < 8) {
          b->next = TI0.Freelist[lVar3];
          TI0.Freelist[lVar3] = b;
        }
        else {
          free(b);
        }
      }
      if (uVar4 < 2) {
        return pBVar2;
      }
      uVar4 = uVar4 >> 1;
      pBVar1 = b_00->next;
      b = pBVar2;
    } while (b_00->next != (Bigint *)0x0);
    pBVar1 = mult(b_00,b_00);
    b_00->next = pBVar1;
  } while( true );
}

Assistant:

static Bigint *
pow5mult(Bigint *b, int k MTd)
{
	Bigint *b1, *p5, *p51;
#ifdef MULTIPLE_THREADS
	ThInfo *TI;
#endif
	int i;
	static int p05[3] = { 5, 25, 125 };

	if ((i = k & 3))
		b = multadd(b, p05[i-1], 0 MTa);

	if (!(k >>= 2))
		return b;
#ifdef  MULTIPLE_THREADS
	if (!(TI = *PTI))
		*PTI = TI = get_TI();
#endif
	if (!(p5 = p5s)) {
		/* first time */
#ifdef MULTIPLE_THREADS
		if (!(TI = *PTI))
			*PTI = TI = get_TI();
		if (TI == &TI0)
			ACQUIRE_DTOA_LOCK(1);
		if (!(p5 = p5s)) {
			p5 = p5s = i2b(625 MTa);
			p5->next = 0;
			}
		if (TI == &TI0)
			FREE_DTOA_LOCK(1);
#else
		p5 = p5s = i2b(625 MTa);
		p5->next = 0;
#endif
		}
	for(;;) {
		if (k & 1) {
			b1 = mult(b, p5 MTa);
			Bfree(b MTa);
			b = b1;
			}
		if (!(k >>= 1))
			break;
		if (!(p51 = p5->next)) {
#ifdef MULTIPLE_THREADS
			if (!TI && !(TI = *PTI))
				*PTI = TI = get_TI();
			if (TI == &TI0)
				ACQUIRE_DTOA_LOCK(1);
			if (!(p51 = p5->next)) {
				p51 = p5->next = mult(p5,p5 MTa);
				p51->next = 0;
				}
			if (TI == &TI0)
				FREE_DTOA_LOCK(1);
#else
			p51 = p5->next = mult(p5,p5);
			p51->next = 0;
#endif
			}
		p5 = p51;
		}
	return b;
	}